

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean list_member(AD *ad,AD *list)

{
  AD *ad1;
  AD *list_local;
  AD *ad_local;
  
  ad1 = list;
  while( true ) {
    if (ad1 == (AD *)0x0) {
      return 0;
    }
    if (ad1 == ad) break;
    ad1 = ad1->next;
  }
  return 1;
}

Assistant:

private Boolean list_member(ad, list)
    AD        *ad;        /* the AD to search for */
    AD        *list;        /* the list to search */
{
    AD        *ad1;        /* traversal pointer */

    for (ad1 = list; ad1; ad1 = ad1->next)
        if (ad1 == ad)
            /* ad is a member of list */
            return MA_TRUE;

    /* ad is not a member of list */
    return MA_FALSE;
}